

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O3

void cfl_predict_hbd_8x16_c(int16_t *pred_buf_q3,uint16_t *dst,int dst_stride,int alpha_q3,int bd)

{
  uint16_t uVar1;
  uint uVar2;
  int iVar3;
  int i;
  long lVar4;
  int iVar5;
  uint uVar6;
  
  iVar3 = 0;
  do {
    lVar4 = 0;
    do {
      iVar5 = pred_buf_q3[lVar4] * alpha_q3;
      if (iVar5 < 0) {
        uVar6 = -(0x20U - iVar5 >> 6);
      }
      else {
        uVar6 = iVar5 + 0x20U >> 6;
      }
      uVar6 = dst[lVar4] + uVar6;
      uVar2 = uVar6;
      if (bd == 10) {
        if (0x3fe < uVar6) {
          uVar2 = 0x3ff;
        }
      }
      else if (bd == 0xc) {
        if (0xffe < uVar6) {
          uVar2 = 0xfff;
        }
      }
      else if (0xfe < uVar6) {
        uVar2 = 0xff;
      }
      uVar1 = (uint16_t)uVar2;
      if ((int)uVar6 < 0) {
        uVar1 = 0;
      }
      dst[lVar4] = uVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    pred_buf_q3 = pred_buf_q3 + 0x20;
    iVar3 = iVar3 + 1;
    dst = dst + dst_stride;
  } while (iVar3 != 0x10);
  return;
}

Assistant:

static void cfl_compute_parameters(MACROBLOCKD *const xd, TX_SIZE tx_size) {
  CFL_CTX *const cfl = &xd->cfl;
  // Do not call cfl_compute_parameters multiple time on the same values.
  assert(cfl->are_parameters_computed == 0);

  cfl_pad(cfl, tx_size_wide[tx_size], tx_size_high[tx_size]);
  cfl_get_subtract_average_fn(tx_size)(cfl->recon_buf_q3, cfl->ac_buf_q3);
  cfl->are_parameters_computed = 1;
}